

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O1

GCfunc * lj_func_newC(lua_State *L,MSize nelems,GCtab *env)

{
  GCfunc *pGVar1;
  
  pGVar1 = (GCfunc *)lj_mem_newgco(L,nelems * 8 + 0x20);
  *(uint8_t *)((long)pGVar1 + 5) = '\b';
  *(uint8_t *)((long)pGVar1 + 6) = '\x01';
  (pGVar1->c).nupvalues = (uint8_t)nelems;
  (pGVar1->c).pc.ptr32 = (L->glref).ptr32 + 0x184;
  (pGVar1->c).env.gcptr32 = (uint32_t)env;
  return pGVar1;
}

Assistant:

GCfunc *lj_func_newC(lua_State *L, MSize nelems, GCtab *env)
{
  GCfunc *fn = (GCfunc *)lj_mem_newgco(L, sizeCfunc(nelems));
  fn->c.gct = ~LJ_TFUNC;
  fn->c.ffid = FF_C;
  fn->c.nupvalues = (uint8_t)nelems;
  /* NOBARRIER: The GCfunc is new (marked white). */
  setmref(fn->c.pc, &G(L)->bc_cfunc_ext);
  setgcref(fn->c.env, obj2gco(env));
  return fn;
}